

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvParticle_dns.c
# Opt level: O0

int PrintUserData(UserData udata)

{
  undefined8 *in_RDI;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = -1;
  }
  else {
    printf("\nParticle traveling on the unit circle example\n");
    printf("---------------------------------------------\n");
    printf("alpha      = %0.4e\n",*in_RDI);
    printf("num orbits = %d\n",(ulong)*(uint *)(in_RDI + 1));
    printf("---------------------------------------------\n");
    printf("rtol       = %g\n",in_RDI[3]);
    printf("atol       = %g\n",in_RDI[4]);
    printf("proj sol   = %d\n",(ulong)*(uint *)(in_RDI + 5));
    printf("proj err   = %d\n",(ulong)*(uint *)((long)in_RDI + 0x2c));
    printf("nout       = %d\n",(ulong)*(uint *)((long)in_RDI + 0x34));
    printf("tstop      = %d\n",(ulong)*(uint *)(in_RDI + 6));
    printf("---------------------------------------------\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int PrintUserData(UserData udata)
{
  if (udata == NULL) { return (-1); }

  printf("\nParticle traveling on the unit circle example\n");
  printf("---------------------------------------------\n");
  printf("alpha      = %0.4" ESYM "\n", udata->alpha);
  printf("num orbits = %d\n", udata->orbits);
  printf("---------------------------------------------\n");
  printf("rtol       = %" GSYM "\n", udata->rtol);
  printf("atol       = %" GSYM "\n", udata->atol);
  printf("proj sol   = %d\n", udata->proj);
  printf("proj err   = %d\n", udata->projerr);
  printf("nout       = %d\n", udata->nout);
  printf("tstop      = %d\n", udata->tstop);
  printf("---------------------------------------------\n");

  return (0);
}